

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParseHeader(DXFImporter *this,LineReader *reader,FileData *param_2)

{
  int iVar1;
  
  iVar1 = reader->end;
  while ((iVar1 < 2 &&
         ((reader->groupcode != 0 ||
          (iVar1 = strcmp("ENDSEC",(reader->value)._M_dataplus._M_p), iVar1 != 0))))) {
    DXF::LineReader::operator++(reader);
    iVar1 = reader->end;
  }
  return;
}

Assistant:

operator bool() const {
        return end <= 1;
    }